

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stochastic.hxx
# Opt level: O3

void __thiscall
StochasticProcess::StochasticProcess(StochasticProcess *this,Time *time,string *name,string *type)

{
  Parametric::Parametric(&this->super_Parametric,name,type);
  TimeDependent::TimeDependent(&this->super_TimeDependent,time);
  Physical::Physical(&this->super_Physical);
  (this->super_Parametric)._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_0015bc60;
  (this->super_TimeDependent)._vptr_TimeDependent = (_func_int **)&PTR__StochasticProcess_0015bce8;
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__StochasticProcess_0015bd30;
  (this->stochDescription)._M_dataplus._M_p = (pointer)&(this->stochDescription).field_2;
  (this->stochDescription)._M_string_length = 0;
  (this->stochDescription).field_2._M_local_buf[0] = '\0';
  this->stochCurrentValue = 0.0;
  this->stochNextValue = 0.0;
  std::__cxx11::string::_M_replace((ulong)&this->stochDescription,0,(char *)0x0,0x14c1bf);
  this->stochNextStateIsPrepared = false;
  return;
}

Assistant:

StochasticProcess(class Time *time, const string& name="", const string& type="Stochastic") : Parametric(name, type), TimeDependent(time) { 
		stochCurrentValue = 0.0;
		stochNextValue = 0.0;
		stochDescription = "stochastic process";
		stochNextStateIsPrepared = false;
	}